

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QPointF __thiscall QGraphicsItem::mapFromScene(QGraphicsItem *this,QPointF *point)

{
  QGraphicsItemPrivate *pQVar1;
  long in_FS_OFFSET;
  double dVar2;
  double in_XMM1_Qa;
  QPointF QVar3;
  QGraphicsItem *that;
  QPointF local_70 [5];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  local_70[0].xp = (qreal)pQVar1->q_ptr;
  QGraphicsItemPrivate::ensureSceneTransformRecursive(pQVar1,(QGraphicsItem **)local_70);
  if ((pQVar1->field_0x167 & 0x40) == 0) {
    QTransform::inverted((bool *)local_70);
    dVar2 = (double)QTransform::map(local_70);
  }
  else {
    pQVar1 = (this->d_ptr).d;
    dVar2 = point->xp - (pQVar1->sceneTransform).m_matrix[2][0];
    in_XMM1_Qa = point->yp - (pQVar1->sceneTransform).m_matrix[2][1];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QVar3.yp = in_XMM1_Qa;
    QVar3.xp = dVar2;
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QPointF QGraphicsItem::mapFromScene(const QPointF &point) const
{
    if (d_ptr->hasTranslateOnlySceneTransform())
        return QPointF(point.x() - d_ptr->sceneTransform.dx(), point.y() - d_ptr->sceneTransform.dy());
    return d_ptr->sceneTransform.inverted().map(point);
}